

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmLocalGenerator *parent,Snapshot snapshot)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  cmMakefile *this_00;
  
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,snapshot);
  this->_vptr_cmLocalGenerator = (_func_int **)&PTR__cmLocalGenerator_005b6d40;
  (this->StateSnapshot).State = snapshot.State;
  (this->StateSnapshot).Position.Tree = snapshot.Position.Tree;
  (this->StateSnapshot).Position.Position = snapshot.Position.Position;
  (this->Children).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Children).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Children).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetImplib)._M_dataplus._M_p = (pointer)&(this->TargetImplib).field_2;
  (this->TargetImplib)._M_string_length = 0;
  (this->TargetImplib).field_2._M_local_buf[0] = '\0';
  bVar2 = cmState::Snapshot::IsValid(&snapshot);
  if (bVar2) {
    this->GlobalGenerator = gg;
    this->Parent = parent;
    if (parent != (cmLocalGenerator *)0x0) {
      AddChild(parent,this);
    }
    this_00 = (cmMakefile *)operator_new(0x870);
    cmMakefile::cmMakefile(this_00,this);
    this->Makefile = this_00;
    this->EmitUniversalBinaryFlags = true;
    this->BackwardsCompatibility = 0;
    this->BackwardsCompatibilityFinal = false;
    return;
  }
  __assert_fail("snapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLocalGenerator.cxx"
                ,0x33,
                "cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator *, cmLocalGenerator *, cmState::Snapshot)"
               );
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg,
                                   cmLocalGenerator* parent,
                                   cmState::Snapshot snapshot)
  : cmOutputConverter(snapshot), StateSnapshot(snapshot)
{
  assert(snapshot.IsValid());
  this->GlobalGenerator = gg;
  this->Parent = parent;
  if (parent)
    {
    parent->AddChild(this);
    }

  this->Makefile = new cmMakefile(this);

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
}